

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::EnergyScan
          (Error *__return_storage_ptr__,CommissionerApp *this,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  uint uVar1;
  element_type *peVar2;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar3;
  basic_string_view<char> bVar4;
  string_view fmt;
  format_args args;
  ErrorCode local_164;
  Error local_160;
  anon_class_1_0_00000001 local_132;
  v10 local_131;
  v10 *local_130;
  size_t local_128;
  string local_120;
  Error local_100;
  undefined1 local_c3;
  uint16_t local_c2;
  uint16_t local_c0;
  byte local_bd;
  uint32_t uStack_bc;
  uint16_t aScanDuration_local;
  uint16_t aPeriod_local;
  uint8_t aCount_local;
  uint32_t aChannelMask_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_c3 = 0;
  aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aDstAddr;
  local_c2 = aScanDuration;
  local_c0 = aPeriod;
  local_bd = aCount;
  uStack_bc = aChannelMask;
  _aPeriod_local = this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar1 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar1 & 1) == 0) {
    EnergyScan::anon_class_1_0_00000001::operator()(&local_132);
    local_58 = &local_130;
    local_60 = &local_131;
    bVar4 = ::fmt::v10::operator()(local_60);
    local_128 = bVar4.size_;
    local_130 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_120;
    local_78 = local_130;
    sStack_70 = local_128;
    local_50 = &local_78;
    local_88 = local_130;
    local_80 = local_128;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = aVar3.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_120,local_88,fmt,args);
    Error::Error(&local_100,kInvalidState,&local_120);
    Error::operator=(__return_storage_ptr__,&local_100);
    Error::~Error(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar2->_vptr_Commissioner[0x30])
              (&local_160,peVar2,(ulong)uStack_bc,(ulong)local_bd,(ulong)local_c0,(ulong)local_c2,
               aDstAddr);
    aError = Error::operator=(__return_storage_ptr__,&local_160);
    local_164 = kNone;
    commissioner::operator!=(aError,&local_164);
    Error::~Error(&local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnergyScan(uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->EnergyScan(aChannelMask, aCount, aPeriod, aScanDuration, aDstAddr));

exit:
    return error;
}